

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O2

void Abc_SclUndoRecentChanges(Abc_Ntk_t *pNtk,Vec_Int_t *vTrans)

{
  int iVar1;
  Abc_Obj_t *pObj;
  Abc_Obj_t *pFaninOld;
  Abc_Obj_t *pFaninNew;
  int i;
  ulong uVar2;
  
  uVar2 = (long)vTrans->nSize / 3;
  if (vTrans->nSize % 3 == 0) {
    i = (int)uVar2 * 3 + -1;
    for (uVar2 = uVar2 & 0xffffffff; 0 < (int)uVar2; uVar2 = (ulong)((int)uVar2 - 1)) {
      iVar1 = Vec_IntEntry(vTrans,i + -2);
      pObj = Abc_NtkObj(pNtk,iVar1);
      iVar1 = Vec_IntEntry(vTrans,i + -1);
      pFaninOld = Abc_NtkObj(pNtk,iVar1);
      iVar1 = Vec_IntEntry(vTrans,i);
      pFaninNew = Abc_NtkObj(pNtk,iVar1);
      Abc_ObjPatchFanin(pObj,pFaninOld,pFaninNew);
      Abc_SclTimeIncUpdateLevel(pObj);
      if (pNtk->vPhases != (Vec_Int_t *)0x0) {
        iVar1 = Abc_SclIsInv(pFaninNew);
        if (iVar1 != 0) {
          Abc_NodeInvUpdateObjFanoutPolarity(pFaninNew,pObj);
        }
      }
      i = i + -3;
    }
    return;
  }
  __assert_fail("Vec_IntSize(vTrans) % 3 == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclUpsize.c"
                ,0x2d3,"void Abc_SclUndoRecentChanges(Abc_Ntk_t *, Vec_Int_t *)");
}

Assistant:

void Abc_SclUndoRecentChanges( Abc_Ntk_t * pNtk, Vec_Int_t * vTrans )
{
    int i;
    assert( Vec_IntSize(vTrans) % 3 == 0 );
    for ( i = Vec_IntSize(vTrans)/3 - 1; i >= 0; i-- )
    {
        Abc_Obj_t * pFanout = Abc_NtkObj( pNtk, Vec_IntEntry(vTrans, 3*i+0) );
        Abc_Obj_t * pFanin  = Abc_NtkObj( pNtk, Vec_IntEntry(vTrans, 3*i+1) );
        Abc_Obj_t * pObj    = Abc_NtkObj( pNtk, Vec_IntEntry(vTrans, 3*i+2) );
        // we do not update load here because times will be recomputed
        Abc_ObjPatchFanin( pFanout, pFanin, pObj );
        Abc_SclTimeIncUpdateLevel( pFanout );
//        printf( "Node %6d  Redir fanout %6d from fanin %6d. \n", 
//            Abc_ObjId(pObj), Abc_ObjId(pFanout), Abc_ObjId(pFanin) );
        // update polarity
        if ( pNtk->vPhases && Abc_SclIsInv(pObj) )
            Abc_NodeInvUpdateObjFanoutPolarity( pObj, pFanout );
    }
}